

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

UChar32 characterIteratorCurrent(UCharIterator *iter)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  
  uVar2 = (**(code **)(*iter->context + 0x88))();
  uVar3 = (uint)uVar2;
  if (uVar2 == 0xffff) {
    cVar1 = (**(code **)(*iter->context + 0x38))();
    uVar3 = -(uint)(cVar1 == '\0') | 0xffff;
  }
  return uVar3;
}

Assistant:

static UChar32 U_CALLCONV
characterIteratorCurrent(UCharIterator *iter) {
    UChar32 c;

    c=((CharacterIterator *)(iter->context))->current();
    if(c!=0xffff || ((CharacterIterator *)(iter->context))->hasNext()) {
        return c;
    } else {
        return U_SENTINEL;
    }
}